

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

int flatbuffers::Vector<flatbuffers::Offset<reflection::Object>,unsigned_int>::
    KeyCompare<std::__cxx11::string>(void *ap,void *bp)

{
  int iVar1;
  
  iVar1 = reflection::Object::KeyCompareWithValue<std::__cxx11::string>
                    ((Object *)((ulong)*bp + (long)bp),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ap);
  return -iVar1;
}

Assistant:

static int KeyCompare(const void *ap, const void *bp) {
    const K *key = reinterpret_cast<const K *>(ap);
    const uint8_t *data = reinterpret_cast<const uint8_t *>(bp);
    auto table = IndirectHelper<T>::Read(data, 0);

    // std::bsearch compares with the operands transposed, so we negate the
    // result here.
    return -table->KeyCompareWithValue(*key);
  }